

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O0

bool __thiscall
google::protobuf::internal::
MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>
::MergePartialFromCodedStream
          (MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>
           *this,CodedInputStream *input)

{
  bool bVar1;
  WireType WVar2;
  KeyMapEntryAccessorType *value;
  ValueMapEntryAccessorType *value_00;
  uint32 tag;
  CodedInputStream *input_local;
  MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>
  *this_local;
  uint32 local_1c;
  uint32 v;
  uint32 local_c;
  
  do {
    while( true ) {
      local_1c = 0;
      if ((input->buffer_ < input->buffer_end_) &&
         (local_1c = (uint32)*input->buffer_, local_1c < 0x80)) {
        io::CodedInputStream::Advance(input,1);
        local_c = local_1c;
      }
      else {
        local_c = io::CodedInputStream::ReadTagFallback(input,local_1c);
      }
      if (local_c != 10) break;
      value = mutable_key(this);
      bVar1 = MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)9,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Read(input,value);
      if (!bVar1) {
        return false;
      }
      set_has_key(this);
      if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '\x10')) {
        io::CodedInputStream::Advance(input,1);
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
      if (bVar1) {
LAB_001cae99:
        value_00 = mutable_value(this);
        bVar1 = MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)3,_long>::Read
                          (input,value_00);
        if (!bVar1) {
          return false;
        }
        set_has_value(this);
        bVar1 = io::CodedInputStream::ExpectAtEnd(input);
        if (bVar1) {
          return true;
        }
      }
    }
    if (local_c == 0x10) goto LAB_001cae99;
    if ((local_c == 0) ||
       (WVar2 = WireFormatLite::GetTagWireType(local_c), WVar2 == WIRETYPE_END_GROUP)) {
      return true;
    }
    bVar1 = WireFormatLite::SkipField(input,local_c);
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool MergePartialFromCodedStream(::google::protobuf::io::CodedInputStream* input) {
    uint32 tag;

    for (;;) {
      // 1) corrupted data: return false;
      // 2) unknown field: skip without putting into unknown field set;
      // 3) unknown enum value: keep it in parsing. In proto2, caller should
      // check the value and put this entry into containing message's unknown
      // field set if the value is an unknown enum. In proto3, caller doesn't
      // need to care whether the value is unknown enum;
      // 4) missing key/value: missed key/value will have default value. caller
      // should take this entry as if key/value is set to default value.
      tag = input->ReadTagNoLastTag();
      switch (tag) {
        case kKeyTag:
          if (!KeyTypeHandler::Read(input, mutable_key())) {
            return false;
          }
          set_has_key();
          if (!input->ExpectTag(kValueTag)) break;
          GOOGLE_FALLTHROUGH_INTENDED;

        case kValueTag:
          if (!ValueTypeHandler::Read(input, mutable_value())) {
            return false;
          }
          set_has_value();
          if (input->ExpectAtEnd()) return true;
          break;

        default:
          if (tag == 0 ||
              WireFormatLite::GetTagWireType(tag) ==
              WireFormatLite::WIRETYPE_END_GROUP) {
            return true;
          }
          if (!WireFormatLite::SkipField(input, tag)) return false;
          break;
      }
    }
  }